

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiTextIndex::append(ImGuiTextIndex *this,char *base,int old_size,int new_size)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  int *in_RDI;
  char *p;
  char *base_end;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *local_28;
  
  if (in_EDX != in_ECX) {
    if ((in_RDI[4] == 0) || (*(char *)(in_RSI + (in_RDI[4] + -1)) == '\n')) {
      ImVector<int>::push_back
                ((ImVector<int> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_RDI);
    }
    local_28 = (void *)(in_RSI + in_EDX);
    while (local_28 = memchr(local_28,10,(in_RSI + in_ECX) - (long)local_28),
          local_28 != (void *)0x0) {
      local_28 = (void *)((long)local_28 + 1);
      if (local_28 < (void *)(in_RSI + in_ECX)) {
        ImVector<int>::push_back
                  ((ImVector<int> *)CONCAT44((int)local_28 - (int)in_RSI,in_stack_ffffffffffffffd0),
                   in_RDI);
      }
    }
    iVar1 = ImMax<int>(in_RDI[4],in_ECX);
    in_RDI[4] = iVar1;
  }
  return;
}

Assistant:

void ImGuiTextIndex::append(const char* base, int old_size, int new_size)
{
    IM_ASSERT(old_size >= 0 && new_size >= old_size && new_size >= EndOffset);
    if (old_size == new_size)
        return;
    if (EndOffset == 0 || base[EndOffset - 1] == '\n')
        LineOffsets.push_back(EndOffset);
    const char* base_end = base + new_size;
    for (const char* p = base + old_size; (p = (const char*)memchr(p, '\n', base_end - p)) != 0; )
        if (++p < base_end) // Don't push a trailing offset on last \n
            LineOffsets.push_back((int)(intptr_t)(p - base));
    EndOffset = ImMax(EndOffset, new_size);
}